

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Type.cxx
# Opt level: O1

Fl_Type * __thiscall Fl_Menu_Item_Type::make(Fl_Menu_Item_Type *this)

{
  char cVar1;
  int iVar2;
  Fl_Button *pFVar3;
  Fl_Widget_Type *this_00;
  undefined **ppuVar4;
  char *n;
  Fl_Type *p;
  
  p = Fl_Type::current;
  if (Fl_Type::current == (Fl_Type *)0x0) {
    p = (Fl_Type *)0x0;
  }
  else if (((force_parent != 0) &&
           (iVar2 = (*Fl_Type::current->_vptr_Fl_Type[0x1e])(Fl_Type::current), iVar2 != 0)) ||
          (iVar2 = (*p->_vptr_Fl_Type[0x16])(p), iVar2 == 0)) {
    p = p->parent;
  }
  force_parent = 0;
  if ((p == (Fl_Type *)0x0) ||
     ((iVar2 = (*p->_vptr_Fl_Type[0x1f])(p), iVar2 == 0 &&
      ((iVar2 = (*p->_vptr_Fl_Type[0x1e])(p), iVar2 == 0 ||
       (iVar2 = (*p->_vptr_Fl_Type[0x16])(p), iVar2 == 0)))))) {
    fl_message("Please select a menu to add to");
    return (Fl_Type *)0x0;
  }
  if ((this->super_Fl_Widget_Type).o == (Fl_Widget *)0x0) {
    pFVar3 = (Fl_Button *)operator_new(0x80);
    Fl_Button::Fl_Button(pFVar3,0,0,100,0x14,(char *)0x0);
    (this->super_Fl_Widget_Type).o = (Fl_Widget *)pFVar3;
    (pFVar3->super_Fl_Widget).label_.size = Fl_Widget_Type::default_size;
  }
  cVar1 = submenuflag;
  this_00 = (Fl_Widget_Type *)operator_new(0xf0);
  memset(this_00,0,0xf0);
  if (cVar1 == '\x01') {
    Fl_Widget_Type::Fl_Widget_Type(this_00);
    ppuVar4 = &PTR_setlabel_002722a0;
  }
  else {
    Fl_Widget_Type::Fl_Widget_Type(this_00);
    ppuVar4 = &PTR_setlabel_00272458;
  }
  (this_00->super_Fl_Type)._vptr_Fl_Type = (_func_int **)ppuVar4;
  pFVar3 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar3,0,0,100,0x14,(char *)0x0);
  this_00->o = (Fl_Widget *)pFVar3;
  (this_00->super_Fl_Type).factory = (Fl_Type *)this;
  Fl_Type::add((Fl_Type *)this_00,p);
  if (reading_file != 0) {
    return &this_00->super_Fl_Type;
  }
  n = "item";
  if (submenuflag != '\0') {
    n = "submenu";
  }
  Fl_Type::label((Fl_Type *)this_00,n);
  return &this_00->super_Fl_Type;
}

Assistant:

Fl_Type *Fl_Menu_Item_Type::make() {
  // Find the current menu item:
  Fl_Type* q = Fl_Type::current;
  Fl_Type* p = q;
  if (p) {
    if ( (force_parent && q->is_menu_item()) || !q->is_parent()) p = p->parent;
  }
  force_parent = 0;
  if (!p || !(p->is_menu_button() || (p->is_menu_item() && p->is_parent()))) {
    fl_message("Please select a menu to add to");
    return 0;
  }
  if (!o) {
    o = new Fl_Button(0,0,100,20); // create template widget
    o->labelsize(Fl_Widget_Type::default_size);
  }

  Fl_Menu_Item_Type* t = submenuflag ? new Fl_Submenu_Type() : new Fl_Menu_Item_Type();
  t->o = new Fl_Button(0,0,100,20);
  t->factory = this;
  t->add(p);
  if (!reading_file) t->label(submenuflag ? "submenu" : "item");
  return t;
}